

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O0

void mathCore::combine_generics(expression *a,_func_bool_expression_ptr *typeFunction)

{
  expression *this;
  size_t sVar1;
  byte bVar2;
  bool bVar3;
  reference ppeVar4;
  _Self local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Self local_68;
  _Self local_60;
  iterator iter;
  undefined1 local_48 [8];
  expSet temp_set;
  _func_bool_expression_ptr *typeFunction_local;
  expression *a_local;
  
  temp_set._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)typeFunction;
  std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::multiset
            ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)local_48);
  bVar2 = (*(code *)temp_set._M_t._M_impl.super__Rb_tree_header._M_node_count)(a);
  if ((bVar2 & 1) != 0) {
    local_60._M_node =
         (_Base_ptr)
         std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                   (&a->contents);
LAB_0010fc4e:
    local_68._M_node =
         (_Base_ptr)
         std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end(&a->contents);
    bVar3 = std::operator!=(&local_60,&local_68);
    sVar1 = temp_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (bVar3) {
      ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_60);
      bVar2 = (*(code *)sVar1)(*ppeVar4);
      if ((bVar2 & 1) == 0) {
LAB_0010fdb6:
        local_80 = (_Base_ptr)std::_Rb_tree_const_iterator<expression_*>::operator++(&local_60,0);
        local_88._M_node =
             (_Base_ptr)
             std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                       (&a->contents);
        bVar3 = std::operator!=(&local_60,&local_88);
        if (bVar3) {
          ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_60);
          bVar3 = is_var(*ppeVar4);
          if (!bVar3) {
            ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_60);
            bVar3 = is_literal(*ppeVar4);
            if (!bVar3) goto LAB_0010fc4e;
          }
          local_60._M_node =
               (_Base_ptr)
               std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                         (&a->contents);
        }
      }
      else {
        ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_60);
        bVar3 = is_negated(*ppeVar4);
        if (bVar3) goto LAB_0010fdb6;
        ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_60);
        bVar3 = is_dualed(*ppeVar4);
        if (bVar3) goto LAB_0010fdb6;
        ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_60);
        mergeMultiSet((expSet *)local_48,&(*ppeVar4)->contents);
        ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_60);
        std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::clear
                  (&(*ppeVar4)->contents);
        ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&local_60);
        this = *ppeVar4;
        if (this != (expression *)0x0) {
          expression::~expression(this);
          operator_delete(this);
        }
        local_78 = local_60._M_node;
        local_70 = (_Base_ptr)
                   std::multiset<expression*,compareUUID,std::allocator<expression*>>::
                   erase_abi_cxx11_((multiset<expression*,compareUUID,std::allocator<expression*>> *
                                    )&a->contents,local_60._M_node);
        local_60._M_node = local_70;
      }
      goto LAB_0010fc4e;
    }
    mergeMultiSet(&a->contents,(expSet *)local_48);
  }
  std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::~multiset
            ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)local_48);
  return;
}

Assistant:

void mathCore::combine_generics(expression * a, bool(*typeFunction)(expression*)) {
	expSet temp_set; // Temporary Storage for new elements


													  // If our children are the same typefunction as ourselves
													  // we merge them into ourselves, which is a feature from C++17!

	if ((*typeFunction)(a)) {
		auto iter = a->contents.begin();
		while (iter != a->contents.end()) {
			// They need to be the same type as us and also not be negated or dualed!
			if ((*typeFunction)(*iter) && !(mathCore::is_negated(*iter) || mathCore::is_dualed(*iter))) {
				/*
				MSVC Does not support this, thats really sad, so we have to build our own merge function!
				a->contents.merge(child->contents);
				*/
				mergeMultiSet(temp_set, (*iter)->contents);
				(*iter)->contents.clear(); // Clearing first before deleting it to prevent recursive deletion
				delete (*iter);

				// Erase returns the next iter, since deleting things invalidates it
				iter = a->contents.erase(iter);
			}
			else {
				iter++;
				// Slight Optimization: All variable expressions have 0 uuid, so they must be at the beginning!
				if (iter != a->contents.end()) {
					if (mathCore::is_var(*iter) || mathCore::is_literal(*iter)) {
						iter = a->contents.end();
					}
				}
			}
		}
		// Finally merge everything we just found into the parent
		mergeMultiSet(a->contents, temp_set);
	}
}